

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86internal.cpp
# Opt level: O0

Error asmjit::X86Internal::argsToFrameInfo(FuncArgsMapper *args,FuncFrameInfo *ffi)

{
  Error _err_3;
  Error _err_2;
  Error _err_1;
  Error _err;
  X86FuncArgsContext ctx;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  FuncFrameInfo *in_stack_fffffffffffffee8;
  X86FuncArgsContext *in_stack_fffffffffffffef0;
  X86FuncArgsContext *in_stack_fffffffffffffef8;
  X86FuncArgsContext *in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff67;
  uint32_t *in_stack_ffffffffffffff68;
  FuncArgsMapper *in_stack_ffffffffffffff70;
  X86FuncArgsContext *in_stack_ffffffffffffff78;
  Error local_c;
  
  X86FuncArgsContext::X86FuncArgsContext
            ((X86FuncArgsContext *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  local_c = X86FuncArgsContext::initWorkData
                      (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68
                       ,(bool)in_stack_ffffffffffffff67);
  if ((((local_c == 0) &&
       (local_c = X86FuncArgsContext::markDstRegsDirty
                            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8), local_c == 0)) &&
      (local_c = X86FuncArgsContext::markRegsForSwaps
                           (in_stack_ffffffffffffff00,(FuncFrameInfo *)in_stack_fffffffffffffef8),
      local_c == 0)) &&
     (local_c = X86FuncArgsContext::markStackArgsReg
                          (in_stack_fffffffffffffef8,(FuncFrameInfo *)in_stack_fffffffffffffef0),
     local_c == 0)) {
    local_c = 0;
  }
  return local_c;
}

Assistant:

ASMJIT_FAVOR_SIZE Error X86Internal::argsToFrameInfo(const FuncArgsMapper& args, FuncFrameInfo& ffi) noexcept {
  X86FuncArgsContext ctx;
  ASMJIT_PROPAGATE(ctx.initWorkData(args, ffi._dirtyRegs, ffi.hasPreservedFP()));

  ASMJIT_PROPAGATE(ctx.markDstRegsDirty(ffi));
  ASMJIT_PROPAGATE(ctx.markRegsForSwaps(ffi));
  ASMJIT_PROPAGATE(ctx.markStackArgsReg(ffi));
  return kErrorOk;
}